

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# high_primitives.c
# Opt level: O0

void al_draw_filled_rounded_rectangle
               (float x1,float y1,float x2,float y2,float rx,float ry,ALLEGRO_COLOR color)

{
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  undefined4 in_XMM6_Da;
  undefined4 in_XMM6_Db;
  undefined8 in_XMM7_Qa;
  int num_segments;
  float scale;
  int ii;
  ALLEGRO_VERTEX vertex_cache [256];
  int local_2434;
  int local_242c;
  float local_2428 [3];
  int in_stack_ffffffffffffdbe4;
  int in_stack_ffffffffffffdbe8;
  int in_stack_ffffffffffffdbec;
  ALLEGRO_BITMAP *in_stack_ffffffffffffdbf0;
  undefined4 in_stack_ffffffffffffdbf8;
  int in_stack_ffffffffffffdbfc;
  float in_stack_ffffffffffffdc00;
  float in_stack_ffffffffffffdc04;
  float in_stack_ffffffffffffdc08;
  float in_stack_ffffffffffffdc0c;
  float in_stack_ffffffffffffdc10;
  float in_stack_ffffffffffffdc14;
  float in_stack_ffffffffffffdc18;
  int in_stack_ffffffffffffdc1c;
  float *in_stack_ffffffffffffdc20;
  float in_stack_ffffffffffffdc68;
  float in_stack_ffffffffffffdc6c;
  float in_stack_ffffffffffffdc70;
  float in_stack_ffffffffffffdc74;
  ALLEGRO_COLOR in_stack_ffffffffffffdc78;
  
  fVar1 = get_scale();
  fVar2 = sqrtf((in_XMM4_Da + in_XMM5_Da) / 2.0);
  local_2434 = (int)((fVar1 * 10.0 * fVar2) / 4.0);
  if (local_2434 < 2) {
    al_draw_filled_rectangle
              (in_stack_ffffffffffffdc74,in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc6c,
               in_stack_ffffffffffffdc68,in_stack_ffffffffffffdc78);
  }
  else {
    if (0xff < local_2434 * 4) {
      local_2434 = 0x3f;
    }
    al_calculate_arc(in_stack_ffffffffffffdc20,in_stack_ffffffffffffdc1c,in_stack_ffffffffffffdc18,
                     in_stack_ffffffffffffdc14,in_stack_ffffffffffffdc10,in_stack_ffffffffffffdc0c,
                     in_stack_ffffffffffffdc08,in_stack_ffffffffffffdc04,in_stack_ffffffffffffdc00,
                     in_stack_ffffffffffffdbfc);
    for (local_242c = 0; local_242c < local_2434; local_242c = local_242c + 1) {
      local_2428[(long)(local_242c + local_2434) * 9] =
           (in_XMM0_Da + in_XMM4_Da) - local_2428[(long)((local_2434 + -1) - local_242c) * 9];
      local_2428[(long)(local_242c + local_2434) * 9 + 1] =
           (in_XMM1_Da + in_XMM5_Da) - local_2428[(long)((local_2434 + -1) - local_242c) * 9 + 1];
      local_2428[(long)(local_242c + local_2434 * 2) * 9] =
           (in_XMM0_Da + in_XMM4_Da) - local_2428[(long)local_242c * 9];
      local_2428[(long)(local_242c + local_2434 * 2) * 9 + 1] =
           (in_XMM3_Da - in_XMM5_Da) + local_2428[(long)local_242c * 9 + 1];
      local_2428[(long)(local_242c + local_2434 * 3) * 9] =
           (in_XMM2_Da - in_XMM4_Da) + local_2428[(long)((local_2434 + -1) - local_242c) * 9];
      local_2428[(long)(local_242c + local_2434 * 3) * 9 + 1] =
           (in_XMM3_Da - in_XMM5_Da) + local_2428[(long)((local_2434 + -1) - local_242c) * 9 + 1];
    }
    for (local_242c = 0; local_242c < local_2434; local_242c = local_242c + 1) {
      local_2428[(long)local_242c * 9] =
           (in_XMM2_Da - in_XMM4_Da) + local_2428[(long)local_242c * 9];
      local_2428[(long)local_242c * 9 + 1] =
           (in_XMM1_Da + in_XMM5_Da) - local_2428[(long)local_242c * 9 + 1];
    }
    for (local_242c = 0; local_242c < local_2434 * 4; local_242c = local_242c + 1) {
      *(ulong *)(&stack0xffffffffffffdbec + (long)local_242c * 0x24) =
           CONCAT44(in_XMM6_Db,in_XMM6_Da);
      *(undefined8 *)(&stack0xffffffffffffdbf4 + (long)local_242c * 0x24) = in_XMM7_Qa;
      local_2428[(long)local_242c * 9 + 2] = 0.0;
    }
    al_draw_prim((void *)CONCAT44(in_stack_ffffffffffffdc04,in_stack_ffffffffffffdc00),
                 (ALLEGRO_VERTEX_DECL *)
                 CONCAT44(in_stack_ffffffffffffdbfc,in_stack_ffffffffffffdbf8),
                 in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbec,in_stack_ffffffffffffdbe8,
                 in_stack_ffffffffffffdbe4);
  }
  return;
}

Assistant:

void al_draw_filled_rounded_rectangle(float x1, float y1, float x2, float y2,
   float rx, float ry, ALLEGRO_COLOR color)
{
   LOCAL_VERTEX_CACHE;
   int ii;
   float scale = get_scale();
   int num_segments = ALLEGRO_PRIM_QUALITY * scale * sqrtf((rx + ry) / 2.0f) / 4;

   ASSERT(rx >= 0);
   ASSERT(ry >= 0);
   
   /* In case rx and ry are both 0. */
   if (num_segments < 2) {
      al_draw_filled_rectangle(x1, y1, x2, y2, color);
      return;
   }

   if (num_segments * 4 >= ALLEGRO_VERTEX_CACHE_SIZE) {
      num_segments = (ALLEGRO_VERTEX_CACHE_SIZE - 1) / 4;
   }
   
   al_calculate_arc(&(vertex_cache[0].x), sizeof(ALLEGRO_VERTEX), 0, 0, rx, ry, 0, ALLEGRO_PI / 2, 0, num_segments + 1);

   for (ii = 0; ii < num_segments; ii++) {
      vertex_cache[ii + 1 * num_segments].x = x1 + rx - vertex_cache[num_segments - 1 - ii].x;
      vertex_cache[ii + 1 * num_segments].y = y1 + ry - vertex_cache[num_segments - 1 - ii].y;

      vertex_cache[ii + 2 * num_segments].x = x1 + rx - vertex_cache[ii].x;
      vertex_cache[ii + 2 * num_segments].y = y2 - ry + vertex_cache[ii].y;

      vertex_cache[ii + 3 * num_segments].x = x2 - rx + vertex_cache[num_segments - 1 - ii].x;
      vertex_cache[ii + 3 * num_segments].y = y2 - ry + vertex_cache[num_segments - 1 - ii].y;
   }
   for (ii = 0; ii < num_segments; ii++) {
      vertex_cache[ii].x = x2 - rx + vertex_cache[ii].x;
      vertex_cache[ii].y = y1 + ry - vertex_cache[ii].y;
   }

   for (ii = 0; ii < 4 * num_segments; ii++) {
      vertex_cache[ii].color = color;
      vertex_cache[ii].z = 0;
   }

   /*
   TODO: Doing this as a triangle fan just doesn't sound all that great, perhaps shuffle the vertices somehow to at least make it a strip
   */
   al_draw_prim(vertex_cache, 0, 0, 0, 4 * num_segments, ALLEGRO_PRIM_TRIANGLE_FAN);
}